

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenAddMemoryImport
               (BinaryenModuleRef module,char *internalName,char *externalModuleName,
               char *externalBaseName,uint8_t shared)

{
  undefined4 uVar1;
  Memory *pMVar2;
  undefined3 in_register_00000081;
  string_view local_60;
  Name local_50;
  undefined4 local_3c;
  _Head_base<0UL,_wasm::Memory_*,_false> local_38;
  __single_object memory;
  
  local_3c = CONCAT31(in_register_00000081,shared);
  wasm::Name::Name((Name *)&local_60,internalName);
  pMVar2 = wasm::Module::getMemoryOrNull(module,(Name)local_60);
  uVar1 = local_3c;
  if (pMVar2 == (Memory *)0x0) {
    std::make_unique<wasm::Memory>();
    wasm::Name::Name(&local_50,internalName);
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_len =
         local_50.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).super_Named.name.super_IString.str._M_str =
         local_50.super_IString.str._M_str;
    wasm::Name::Name(&local_50,externalModuleName);
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len =
         local_50.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str =
         local_50.super_IString.str._M_str;
    wasm::Name::Name(&local_50,externalBaseName);
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len =
         local_50.super_IString.str._M_len;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str =
         local_50.super_IString.str._M_str;
    (local_38._M_head_impl)->shared = (char)uVar1 != '\0';
    wasm::Module::addMemory
              (module,(unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_38);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr
              ((unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *)&local_38);
  }
  else {
    wasm::Name::Name(&local_50,externalModuleName);
    (pMVar2->super_Importable).module.super_IString.str._M_len = local_50.super_IString.str._M_len;
    (pMVar2->super_Importable).module.super_IString.str._M_str = local_50.super_IString.str._M_str;
    wasm::Name::Name(&local_50,externalBaseName);
    (pMVar2->super_Importable).base.super_IString.str._M_len = local_50.super_IString.str._M_len;
    (pMVar2->super_Importable).base.super_IString.str._M_str = local_50.super_IString.str._M_str;
  }
  return;
}

Assistant:

void BinaryenAddMemoryImport(BinaryenModuleRef module,
                             const char* internalName,
                             const char* externalModuleName,
                             const char* externalBaseName,
                             uint8_t shared) {
  auto* memory = ((Module*)module)->getMemoryOrNull(internalName);
  if (memory == nullptr) {
    auto memory = std::make_unique<Memory>();
    memory->name = internalName;
    memory->module = externalModuleName;
    memory->base = externalBaseName;
    memory->shared = shared;
    ((Module*)module)->addMemory(std::move(memory));
  } else {
    // already exists so just set module and base
    memory->module = externalModuleName;
    memory->base = externalBaseName;
  }
}